

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_button_pop_behavior(nk_context *ctx)

{
  nk_config_stack_button_behavior *pnVar1;
  nk_config_stack_button_behavior_element *pnVar2;
  int iVar3;
  nk_config_stack_button_behavior_element *element;
  nk_config_stack_button_behavior *button_stack;
  nk_context *ctx_local;
  nk_bool local_4;
  
  if (ctx == (nk_context *)0x0) {
    local_4 = 0;
  }
  else {
    pnVar1 = &(ctx->stacks).button_behaviors;
    if (pnVar1->head < 1) {
      local_4 = 0;
    }
    else {
      iVar3 = pnVar1->head + -1;
      pnVar1->head = iVar3;
      pnVar2 = (ctx->stacks).button_behaviors.elements + iVar3;
      *pnVar2->address = pnVar2->old_value;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_button_pop_behavior(struct nk_context *ctx)
{
struct nk_config_stack_button_behavior *button_stack;
struct nk_config_stack_button_behavior_element *element;

NK_ASSERT(ctx);
if (!ctx) return 0;

button_stack = &ctx->stacks.button_behaviors;
NK_ASSERT(button_stack->head > 0);
if (button_stack->head < 1)
return 0;

element = &button_stack->elements[--button_stack->head];
*element->address = element->old_value;
return 1;
}